

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O2

void test_read_bits(uchar *buf,uchar **p,size_t *bit_offset,size_t *bits_available,
                   size_t bits_wanted)

{
  size_t *psVar1;
  ostream *poVar2;
  runtime_error *this;
  uchar *puVar3;
  long lVar4;
  size_t *psVar5;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (bits_available <= (size_t *)*bit_offset) {
    lVar4 = *(long *)buf;
    for (; bits_available != (size_t *)0x0;
        bits_available = (size_t *)((long)bits_available - (long)psVar1)) {
      psVar5 = (size_t *)(*p + 1);
      psVar1 = bits_available;
      if (psVar5 < bits_available) {
        psVar1 = psVar5;
      }
      if (bits_available < psVar5) {
        puVar3 = (uchar *)((long)psVar5 + (-1 - (long)psVar1));
      }
      else {
        lVar4 = lVar4 + 1;
        *(long *)buf = lVar4;
        puVar3 = (uchar *)0x7;
      }
      *p = puVar3;
      *bit_offset = *bit_offset - (long)psVar1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"bits read: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", result = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    print_values(*(long *)buf + -0x20c0b6,(size_t)*p,*bit_offset);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_b0,(unsigned_long)bits_available);
  std::operator+(&local_90,"overflow reading bit stream: wanted = ",&local_b0);
  std::operator+(&local_70,&local_90,"; available = ");
  std::__cxx11::to_string(&local_d0,*bit_offset);
  std::operator+(&local_50,&local_70,&local_d0);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void
test_read_bits(
    unsigned char const* buf,
    unsigned char const*& p,
    size_t& bit_offset,
    size_t& bits_available,
    size_t bits_wanted)
{
    unsigned long result = QIntC::to_ulong(read_bits(p, bit_offset, bits_available, bits_wanted));

    std::cout << "bits read: " << bits_wanted << ", result = " << result << std::endl;
    print_values(p - buf, bit_offset, bits_available);
}